

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGridHeader.cpp
# Opt level: O0

void __thiscall PatternGridHeader::contextMenuEvent(PatternGridHeader *this,QContextMenuEvent *evt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  QPoint *pQVar3;
  QPoint *pQVar4;
  Object local_e0 [8];
  QString local_d8;
  code *local_c0;
  undefined8 local_b8;
  PatternGridHeader *local_b0;
  int local_a8;
  Object local_a0 [8];
  QString local_98;
  code *local_80;
  undefined8 local_78;
  PatternGridHeader *local_70;
  int iStack_68;
  Object local_60 [8];
  QString local_58;
  int local_40;
  int local_3c;
  int trackHover;
  int channelNum;
  QAction *act;
  QPoint *local_20;
  QMenu *menu;
  QContextMenuEvent *evt_local;
  PatternGridHeader *this_local;
  
  menu = (QMenu *)evt;
  evt_local = (QContextMenuEvent *)this;
  pQVar3 = (QPoint *)operator_new(0x28);
  QMenu::QMenu((QMenu *)pQVar3,&this->super_QWidget);
  local_20 = pQVar3;
  QWidget::setAttribute((WidgetAttribute)pQVar3,true);
  pQVar3 = local_20;
  if (this->mTrackHover != -1) {
    local_3c = this->mTrackHover + 1;
    local_40 = this->mTrackHover;
    toggleChannelString(&local_58,local_3c);
    _trackHover = QMenu::addAction((QString *)pQVar3);
    QString::~QString(&local_58);
    iStack_68 = local_40;
    local_80 = QAction::triggered;
    local_78 = 0;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = this;
    local_70 = this;
    QObject::
    connect<void(QAction::*)(bool),PatternGridHeader::contextMenuEvent(QContextMenuEvent*)::__0>
              (local_60,_trackHover,(QObject *)QAction::triggered,
               (anon_class_16_2_c78feb2c_for_function)(auVar1 << 0x40),AutoConnection);
    QMetaObject::Connection::~Connection((Connection *)local_60);
    pQVar3 = local_20;
    soloChannelString(&local_98,local_3c);
    _trackHover = QMenu::addAction((QString *)pQVar3);
    QString::~QString(&local_98);
    local_a8 = local_40;
    local_c0 = QAction::triggered;
    local_b8 = 0;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = this;
    local_b0 = this;
    QObject::
    connect<void(QAction::*)(bool),PatternGridHeader::contextMenuEvent(QContextMenuEvent*)::__1>
              (local_a0,_trackHover,(QObject *)QAction::triggered,
               (anon_class_16_2_c78feb2c_for_function)(auVar2 << 0x40),AutoConnection);
    QMetaObject::Connection::~Connection((Connection *)local_a0);
    QMenu::addSeparator();
  }
  pQVar3 = local_20;
  tr(&local_d8,"Unmute all channels",(char *)0x0,-1);
  _trackHover = QMenu::addAction((QString *)pQVar3);
  QString::~QString(&local_d8);
  QObject::connect<void(QAction::*)(bool),void(PatternGridHeader::*)()>
            (local_e0,_trackHover,(Object *)QAction::triggered,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_e0);
  pQVar3 = local_20;
  pQVar4 = QContextMenuEvent::globalPos((QContextMenuEvent *)menu);
  QMenu::popup(pQVar3,(QAction *)pQVar4);
  return;
}

Assistant:

void PatternGridHeader::contextMenuEvent(QContextMenuEvent *evt) {
    auto menu = new QMenu(this);
    menu->setAttribute(Qt::WA_DeleteOnClose);

    QAction *act;

    if (mTrackHover != HOVER_NONE) {
        // add actions for the current track
        auto channelNum = mTrackHover + 1;
        auto trackHover = mTrackHover;
        act = menu->addAction(toggleChannelString(channelNum));
        connect(act, &QAction::triggered, this,
            [this, trackHover]() {
                toggleTrack(trackHover);
            });
        act = menu->addAction(soloChannelString(channelNum));
        connect(act, &QAction::triggered, this,
            [this, trackHover]() {
                soloTrack(trackHover);
            });
        menu->addSeparator();
    }

    act = menu->addAction(tr("Unmute all channels"));
    connect(act, &QAction::triggered, this, &PatternGridHeader::unmuteAll);

    menu->popup(evt->globalPos());
}